

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool QMetaType::registerConverterFunction(ConverterFunction *f,QMetaType from,QMetaType to)

{
  bool bVar1;
  Type *this;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
  *in_stack_ffffffffffffffb8;
  pair<int,_int> in_stack_ffffffffffffffc8;
  int local_28;
  int local_24;
  pair<int,_int> local_20;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
         ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
                       *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_24 = id((QMetaType *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff8c);
  local_28 = id((QMetaType *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff8c);
  std::pair<int,_int>::pair<int,_int,_true>(&local_20,&local_24,&local_28);
  bVar1 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
          ::insertIfNotContains
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc8,
                     (function<bool_(const_void_*,_void_*)> *)
                     CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    pcVar2 = name(&local_10);
    pcVar3 = name(&local_18);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffb8,
               "Type conversion already registered from type %s to type %s",pcVar2,pcVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return !bVar1;
}

Assistant:

bool QMetaType::registerConverterFunction(const ConverterFunction &f, QMetaType from, QMetaType to)
{
    if (!customTypesConversionRegistry()->insertIfNotContains({from.id(), to.id()}, f)) {
        qWarning("Type conversion already registered from type %s to type %s",
                 from.name(), to.name());
        return false;
    }
    return true;
}